

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Double(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,double d)

{
  Stack<rapidjson::CrtAllocator> *in_RDI;
  size_t in_XMM0_Qa;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *ret
  ;
  char **d_00;
  char **this_00;
  
  d_00 = &in_RDI->stackEnd_;
  this_00 = d_00;
  if ((long)in_RDI[1].stack_ - (long)in_RDI[1].ownAllocator_ < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (in_RDI,in_XMM0_Qa);
  }
  d_00[3] = (char *)((long)d_00[3] + 0x10);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this_00,(double)d_00);
  return true;
}

Assistant:

bool Double(double d) { new (stack_.template Push<ValueType>()) ValueType(d); return true; }